

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

PDFObject * __thiscall PDFObjectParser::ParseArray(PDFObjectParser *this)

{
  bool bVar1;
  __type _Var2;
  EStatusCode EVar3;
  PDFArray *this_00;
  Trace *pTVar4;
  int iVar5;
  undefined8 local_80 [4];
  RefCountPtr<PDFObject> anObject;
  string token;
  
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  EVar3 = IncreaseAndCheckDepth(this);
  if (EVar3 == eSuccess) {
    this_00 = (PDFArray *)operator_new(0x60);
    PDFArray::PDFArray(this_00);
    iVar5 = 0;
    while( true ) {
      bVar1 = GetNextToken(this,&token);
      if (!bVar1 || iVar5 != 0) break;
      _Var2 = std::operator==(&scRightSquare_abi_cxx11_,&token);
      if (_Var2) break;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(&this->mTokenBuffer,&token);
      anObject.mValue = ParseNewObject(this);
      anObject._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d890;
      if (anObject.mValue == (PDFObject *)0x0) {
        pTVar4 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)local_80,(ulong)&token);
        Trace::TraceToLog(pTVar4,
                          "PDFObjectParser::ParseArray, failure to parse array, failed to parse a member object. token = %s"
                          ,local_80[0]);
        std::__cxx11::string::~string((string *)local_80);
        iVar5 = -1;
      }
      else {
        iVar5 = 0;
        PDFArray::AppendObject(this_00,anObject.mValue);
      }
      RefCountPtr<PDFObject>::~RefCountPtr(&anObject);
    }
    EVar3 = DecreaseAndCheckDepth(this);
    if (iVar5 == 0 && (bVar1 && EVar3 == eSuccess)) goto LAB_001a2309;
    (*(this_00->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])(this_00);
    pTVar4 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)local_80,(ulong)&token);
    Trace::TraceToLog(pTVar4,
                      "PDFObjectParser::ParseArray, failure to parse array, didn\'t find end of array or failure to parse array member object. token = %s"
                      ,local_80[0]);
    std::__cxx11::string::~string((string *)local_80);
  }
  this_00 = (PDFArray *)0x0;
LAB_001a2309:
  std::__cxx11::string::~string((string *)&token);
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseArray()
{
	PDFArray* anArray;
	bool arrayEndEncountered = false;
	std::string token;
	EStatusCode status = PDFHummus::eSuccess;

	if(IncreaseAndCheckDepth() != eSuccess)
		return NULL;

	anArray = new PDFArray();

	// easy one. just loop till you get to a closing bracket token and recurse
	while(GetNextToken(token) && PDFHummus::eSuccess == status)
	{
		arrayEndEncountered = (scRightSquare == token);
		if(arrayEndEncountered)
			break;

		ReturnTokenToBuffer(token);
		RefCountPtr<PDFObject> anObject(ParseNewObject());
		if(!anObject)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseArray, failure to parse array, failed to parse a member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		}
		else
		{
			anArray->AppendObject(anObject.GetPtr());
		}
	}

	if(DecreaseAndCheckDepth() != eSuccess)
		status = eFailure;

	if(arrayEndEncountered && PDFHummus::eSuccess == status)
	{
		return anArray;
	}
	else
	{
		delete anArray;
		TRACE_LOG1("PDFObjectParser::ParseArray, failure to parse array, didn't find end of array or failure to parse array member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}
}